

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

ON_2dPoint __thiscall
ON_OBSOLETE_V5_DimLinear::Dim2dPoint(ON_OBSOLETE_V5_DimLinear *this,int point_index)

{
  ON_2dPoint OVar1;
  int iVar2;
  ON_2dPoint *pOVar3;
  ON_2dPoint *points;
  int point_index_local;
  ON_OBSOLETE_V5_DimLinear *this_local;
  ON_2dPoint p2;
  
  iVar2 = ON_SimpleArray<ON_2dPoint>::Count
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                      super_ON_SimpleArray<ON_2dPoint>);
  if (iVar2 < 5) {
    p2.x = -1.23432101234321e+308;
    this_local = (ON_OBSOLETE_V5_DimLinear *)0xffe5f8bd9e331dd2;
  }
  else {
    points._4_4_ = point_index;
    if ((point_index == 10000) &&
       (points._4_4_ = 0x2711,
       ((this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext & 1U) != 0)) {
      points._4_4_ = 4;
    }
    pOVar3 = ON_SimpleArray<ON_2dPoint>::Array
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>);
    if (points._4_4_ == 0) {
      this_local = (ON_OBSOLETE_V5_DimLinear *)pOVar3->x;
      p2.x = pOVar3->y;
    }
    else if (points._4_4_ == 1) {
      this_local = (ON_OBSOLETE_V5_DimLinear *)pOVar3->x;
      p2.x = pOVar3[1].y;
    }
    else if (points._4_4_ == 2) {
      this_local = (ON_OBSOLETE_V5_DimLinear *)pOVar3[2].x;
      p2.x = pOVar3[2].y;
    }
    else if (points._4_4_ == 3) {
      this_local = (ON_OBSOLETE_V5_DimLinear *)pOVar3[2].x;
      p2.x = pOVar3[1].y;
    }
    else if (points._4_4_ == 4) {
      this_local = (ON_OBSOLETE_V5_DimLinear *)pOVar3[4].x;
      p2.x = pOVar3[4].y;
    }
    else if (points._4_4_ == 0x2711) {
      this_local = (ON_OBSOLETE_V5_DimLinear *)((pOVar3->x + pOVar3[2].x) * 0.5);
      p2.x = pOVar3[1].y;
    }
    else {
      p2.x = -1.23432101234321e+308;
      this_local = (ON_OBSOLETE_V5_DimLinear *)0xffe5f8bd9e331dd2;
    }
  }
  OVar1.y = p2.x;
  OVar1.x = (double)this_local;
  return OVar1;
}

Assistant:

ON_2dPoint ON_OBSOLETE_V5_DimLinear::Dim2dPoint( int point_index ) const
{
  ON_2dPoint p2;
  if ( m_points.Count() < dim_pt_count )
  {
    p2.x = p2.y = ON_UNSET_VALUE;
  }
  else
  {
    if ( text_pivot_pt == point_index )
    {
      point_index = m_userpositionedtext ? userpositionedtext_pt_index : dim_mid_pt;
    }

    const ON_2dPoint* points = m_points.Array();
    switch(point_index)
    {
    case ext0_pt_index:
      p2 = points[0];
      break;

    case arrow0_pt_index:
      p2.x = points[0].x;
      p2.y = points[1].y;
      break;

    case ext1_pt_index:
      p2 = points[2];
      break;

    case arrow1_pt_index:
      p2.x = points[2].x;
      p2.y = points[1].y;
      break;

    case userpositionedtext_pt_index:
      p2.x = points[4].x;
      p2.y = points[4].y;
      break;

    case dim_mid_pt:
      p2.x = 0.5*(points[0].x + points[2].x);
      p2.y = points[1].y;
      break;

    default:
      p2.x = p2.y = ON_UNSET_VALUE;
      break;
    }
  }
  return p2;
}